

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceEntryPoint
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *use)

{
  uint **ppuVar1;
  IRContext *this_00;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Operand *__args;
  uint **ppuVar5;
  bool bVar6;
  uint32_t idx;
  uint index;
  uint32_t i;
  initializer_list<unsigned_int> init_list;
  uint32_t local_cc;
  OperandList new_operands;
  Operand local_a8;
  string local_78;
  SmallVector<unsigned_int,_2UL> local_58;
  
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  index = 0;
  bVar6 = false;
  do {
    if ((uint)(((long)(use->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(use->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= index) {
      this_00 = (this->super_Pass).context_;
      if (bVar6) {
        uVar4 = descsroautil::GetNumberOfElementsForArrayOrStruct(this_00,var);
        for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          local_cc = GetReplacementVariable(this,var,uVar3);
          init_list._M_len = 1;
          init_list._M_array = &local_cc;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
          local_a8.type = SPV_OPERAND_TYPE_ID;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&new_operands,&local_a8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
        }
        Instruction::ReplaceOperands(use,&new_operands);
        IRContext::UpdateDefUse((this->super_Pass).context_,use);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"Variable cannot be replaced: invalid instruction",
                   (allocator<char> *)&local_a8);
        IRContext::EmitErrorMessage(this_00,&local_78,use);
        std::__cxx11::string::_M_dispose();
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&new_operands);
      return bVar6;
    }
    __args = Instruction::GetOperand(use,index);
    if (__args->type == SPV_OPERAND_TYPE_ID) {
      ppuVar1 = (uint **)(__args->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar5 = &(__args->words).small_data_;
      if (ppuVar1 != (uint **)0x0) {
        ppuVar5 = ppuVar1;
      }
      uVar4 = **ppuVar5;
      uVar3 = Instruction::result_id(var);
      bVar2 = true;
      if (uVar4 != uVar3) goto LAB_004ddba4;
    }
    else {
LAB_004ddba4:
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &new_operands,__args);
      bVar2 = bVar6;
    }
    bVar6 = bVar2;
    index = index + 1;
  } while( true );
}

Assistant:

bool DescriptorScalarReplacement::ReplaceEntryPoint(Instruction* var,
                                                    Instruction* use) {
  // Build a new |OperandList| for |use| that removes |var| and adds its
  // replacement variables.
  Instruction::OperandList new_operands;

  // Copy all operands except |var|.
  bool found = false;
  for (uint32_t idx = 0; idx < use->NumOperands(); idx++) {
    Operand& op = use->GetOperand(idx);
    if (op.type == SPV_OPERAND_TYPE_ID && op.words[0] == var->result_id()) {
      found = true;
    } else {
      new_operands.emplace_back(op);
    }
  }

  if (!found) {
    context()->EmitErrorMessage(
        "Variable cannot be replaced: invalid instruction", use);
    return false;
  }

  // Add all new replacement variables.
  uint32_t num_replacement_vars =
      descsroautil::GetNumberOfElementsForArrayOrStruct(context(), var);
  for (uint32_t i = 0; i < num_replacement_vars; i++) {
    new_operands.push_back(
        {SPV_OPERAND_TYPE_ID, {GetReplacementVariable(var, i)}});
  }

  use->ReplaceOperands(new_operands);
  context()->UpdateDefUse(use);
  return true;
}